

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_> *
__thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
          (RepeatedPtrFieldBase *this,int index)

{
  void **ppvVar1;
  
  if (index < 0) {
    Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
              ();
  }
  else if (index < this->current_size_) {
    ppvVar1 = element_at(this,index);
    return (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
            *)*ppvVar1;
  }
  Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
            ();
}

Assistant:

Value<TypeHandler>* Mutable(int index) {
    if constexpr (GetBoundsCheckMode() == BoundsCheckMode::kAbort) {
      RuntimeAssertInBounds(index, current_size_);
    } else {
      ABSL_DCHECK_GE(index, 0);
      ABSL_DCHECK_LT(index, current_size_);
    }
    return cast<TypeHandler>(element_at(index));
  }